

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

int filter_wrapper(CManager cm,_event_item *event,void *client_data,attr_list attrs,int out_count,
                  int *out_stones)

{
  long lVar1;
  FILE *pFVar2;
  uint uVar3;
  int iVar4;
  __pid_t _Var5;
  pthread_t pVar6;
  timespec ts;
  ev_state_data ev_state;
  
  lVar1 = *(long *)((long)client_data + 0x20);
  ev_state.cm = cm;
  ev_state.cur_event = event;
  ev_state.out_count = out_count;
  ev_state.out_stones = out_stones;
  if (lVar1 == 0) {
    uVar3 = (**(code **)((long)client_data + 0x10))(event->decoded_event,attrs);
  }
  else {
    cod_assoc_client_data(lVar1,0x34567890,&ev_state);
    uVar3 = (*(code *)**(undefined8 **)((long)client_data + 0x18))(lVar1,event->decoded_event,attrs)
    ;
  }
  if (uVar3 == 0) {
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,"Filter function returned %d, NOT submitting\n",0);
    }
    fflush((FILE *)cm->CMTrace_file);
  }
  else {
    iVar4 = CMtrace_val[10];
    if (cm->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(cm,EVerbose);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar2 = (FILE *)cm->CMTrace_file;
        _Var5 = getpid();
        pVar6 = pthread_self();
        fprintf(pFVar2,"P%lxT%lx - ",(long)_Var5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&ts);
        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
      }
      fprintf((FILE *)cm->CMTrace_file,
              "Filter function returned %d, submitting further to stone %d\n",(ulong)uVar3,
              (ulong)(uint)*out_stones);
    }
    fflush((FILE *)cm->CMTrace_file);
    internal_path_submit(cm,*out_stones,event);
  }
  return uVar3;
}

Assistant:

static int
filter_wrapper(CManager cm, struct _event_item *event, void *client_data,
	       attr_list attrs, int out_count, int *out_stones)
{
    response_instance instance = (response_instance)client_data;
    int ret;
    cod_exec_context ec = instance->u.filter.ec;
    struct ev_state_data ev_state;

    ev_state.cm = cm;
    ev_state.cur_event = event;
    ev_state.out_count = out_count;
    ev_state.out_stones = out_stones;
    if (ec != NULL) {
#ifdef HAVE_COD_H
	cod_assoc_client_data(ec, 0x34567890, (intptr_t)&ev_state);

	ret = ((int(*)(cod_exec_context, void *, attr_list))instance->u.filter.code->func)(ec, event->decoded_event, attrs);
#endif
    } else {
	/* DLL-based handler */
	ret = ((int(*)(void *, attr_list))instance->u.filter.func_ptr)(event->decoded_event, attrs);
    }
    if (ret) {
	CMtrace_out(cm, EVerbose, "Filter function returned %d, submitting further to stone %d\n", ret, out_stones[0]);
	internal_path_submit(cm, out_stones[0], event);
    } else {
	CMtrace_out(cm, EVerbose, "Filter function returned %d, NOT submitting\n", ret);
    }
    return ret;
}